

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  undefined8 uVar3;
  type_conflict5 tVar4;
  DataKey DVar5;
  long lVar6;
  long lVar7;
  undefined4 in_register_00000084;
  cpp_dec_float<100U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  int local_1fc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_198;
  cpp_dec_float<100U,_int,_void> *local_190;
  long local_188;
  long local_180;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)start;
  a = (pSVar1->theTest).val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start + lVar7;
  local_1f8.m_backend.fpclass = cpp_dec_float_finite;
  local_1f8.m_backend.prec_elem = 0x10;
  local_1f8.m_backend.data._M_elems[0] = 0;
  local_1f8.m_backend.data._M_elems[1] = 0;
  local_1f8.m_backend.data._M_elems[2] = 0;
  local_1f8.m_backend.data._M_elems[3] = 0;
  local_1f8.m_backend.data._M_elems[4] = 0;
  local_1f8.m_backend.data._M_elems[5] = 0;
  local_1f8.m_backend.data._M_elems[6] = 0;
  local_1f8.m_backend.data._M_elems[7] = 0;
  local_1f8.m_backend.data._M_elems[0xc] = 0;
  local_1f8.m_backend.data._M_elems[0xd] = 0;
  local_1f8.m_backend.data._M_elems._56_5_ = 0;
  local_1f8.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_1f8.m_backend.exp = 0;
  local_1f8.m_backend.neg = false;
  local_1f8.m_backend.data._M_elems[8] = 0;
  local_1f8.m_backend.data._M_elems[9] = 0;
  local_1f8.m_backend.data._M_elems[10] = 0;
  local_1f8.m_backend.data._M_elems[0xb] = 0;
  local_190 = &(this->last).m_backend;
  lVar6 = (long)incr;
  local_180 = (long)(int)(((long)(pSVar1->weights).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar2) / 0x50);
  v = &pnVar2[lVar7].m_backend;
  local_1fc = -1;
  local_1a0 = best;
  local_198 = this;
  local_188 = lVar6;
  for (; lVar7 < local_180; lVar7 = lVar7 + local_188) {
    local_1f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(a->m_backend).data._M_elems;
    local_1f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((a->m_backend).data._M_elems + 2);
    local_1f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((a->m_backend).data._M_elems + 4);
    local_1f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((a->m_backend).data._M_elems + 6);
    local_1f8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((a->m_backend).data._M_elems + 8);
    local_1f8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((a->m_backend).data._M_elems + 10);
    local_1f8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((a->m_backend).data._M_elems + 0xc);
    uVar3 = *(undefined8 *)((a->m_backend).data._M_elems + 0xe);
    local_1f8.m_backend.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_1f8.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_1f8.m_backend.exp = (a->m_backend).exp;
    local_1f8.m_backend.neg = (a->m_backend).neg;
    local_1f8.m_backend.fpclass = (a->m_backend).fpclass;
    local_1f8.m_backend.prec_elem = (a->m_backend).prec_elem;
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10)
    ;
    result.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
    result.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar4 = boost::multiprecision::operator<(a,&result);
    if (tVar4) {
      uStack_50 = CONCAT35(local_1f8.m_backend.data._M_elems[0xf]._1_3_,
                           local_1f8.m_backend.data._M_elems._56_5_);
      local_88 = (devexpr  [8])local_1f8.m_backend.data._M_elems._0_8_;
      auStack_80[0] = local_1f8.m_backend.data._M_elems[2];
      auStack_80[1] = local_1f8.m_backend.data._M_elems[3];
      local_78[0] = local_1f8.m_backend.data._M_elems[4];
      local_78[1] = local_1f8.m_backend.data._M_elems[5];
      auStack_70[0] = local_1f8.m_backend.data._M_elems[6];
      auStack_70[1] = local_1f8.m_backend.data._M_elems[7];
      local_68[0] = local_1f8.m_backend.data._M_elems[8];
      local_68[1] = local_1f8.m_backend.data._M_elems[9];
      auStack_60[0] = local_1f8.m_backend.data._M_elems[10];
      auStack_60[1] = local_1f8.m_backend.data._M_elems[0xb];
      local_58[0] = local_1f8.m_backend.data._M_elems[0xc];
      local_58[1] = local_1f8.m_backend.data._M_elems[0xd];
      local_48 = local_1f8.m_backend.exp;
      local_44 = local_1f8.m_backend.neg;
      local_40 = local_1f8.m_backend.fpclass;
      iStack_3c = local_1f8.m_backend.prec_elem;
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
      local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
      local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
      local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
      local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
      local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((v->data)._M_elems + 10);
      local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((v->data)._M_elems + 0xc);
      local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((v->data)._M_elems + 0xe);
      local_d8.m_backend.exp = v->exp;
      local_d8.m_backend.neg = v->neg;
      local_d8.m_backend.fpclass = v->fpclass;
      local_d8.m_backend.prec_elem = v->prec_elem;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_128.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_128.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_128.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_128.m_backend.exp = (feastol->m_backend).exp;
      local_128.m_backend.neg = (feastol->m_backend).neg;
      local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_88,&local_d8,&local_128,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_register_00000084,incr));
      local_1f8.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
      local_1f8.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
      local_1f8.m_backend.data._M_elems._56_5_ = result.m_backend.data._M_elems._56_5_;
      local_1f8.m_backend.data._M_elems[0xf]._1_3_ = result.m_backend.data._M_elems[0xf]._1_3_;
      local_1f8.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
      local_1f8.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
      local_1f8.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
      local_1f8.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
      local_1f8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_1f8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_1f8.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
      local_1f8.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
      local_1f8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_1f8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_1f8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_1f8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_1f8.m_backend.exp = result.m_backend.exp;
      local_1f8.m_backend.neg = result.m_backend.neg;
      local_1f8.m_backend.fpclass = result.m_backend.fpclass;
      local_1f8.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar4 = boost::multiprecision::operator>(&local_1f8,local_1a0);
      if (tVar4) {
        *(undefined8 *)((local_1a0->m_backend).data._M_elems + 0xc) =
             local_1f8.m_backend.data._M_elems._48_8_;
        *(ulong *)((local_1a0->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_1f8.m_backend.data._M_elems[0xf]._1_3_,
                      local_1f8.m_backend.data._M_elems._56_5_);
        *(undefined8 *)((local_1a0->m_backend).data._M_elems + 8) =
             local_1f8.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((local_1a0->m_backend).data._M_elems + 10) =
             local_1f8.m_backend.data._M_elems._40_8_;
        *(undefined8 *)((local_1a0->m_backend).data._M_elems + 4) =
             local_1f8.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((local_1a0->m_backend).data._M_elems + 6) =
             local_1f8.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(local_1a0->m_backend).data._M_elems =
             local_1f8.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((local_1a0->m_backend).data._M_elems + 2) =
             local_1f8.m_backend.data._M_elems._8_8_;
        (local_1a0->m_backend).exp = local_1f8.m_backend.exp;
        (local_1a0->m_backend).neg = local_1f8.m_backend.neg;
        (local_1a0->m_backend).fpclass = local_1f8.m_backend.fpclass;
        (local_1a0->m_backend).prec_elem = local_1f8.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_190,v);
        local_1fc = (int)lVar7;
      }
    }
    a = a + lVar6;
    v = v + lVar6;
  }
  if (local_1fc < 0) {
    DVar5.info = 0;
    DVar5.idx = -1;
  }
  else {
    DVar5 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((local_198->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,local_1fc);
  }
  return (SPxId)DVar5;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseCoDim(R& best, R feastol, int start, int incr)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int end = this->thesolver->weights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->test().dim());

   for(; start < end; start += incr)
   {
      x = test[start];

      if(test[start] < -feastol)
      {
         x = devexpr::computePrice(x, pen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = pen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}